

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O0

void __thiscall VcdGen::VcdGenerator::header(VcdGenerator *this)

{
  VcdGenerator *this_local;
  
  std::__cxx11::string::operator+=
            ((string *)&this->vcd_data_,
             "$date\n    Aug 27, 2021\n$end\n$version\n   VCD generator tool version V0.1\n$end\n$timescale 1ps $end\n"
            );
  return;
}

Assistant:

void header()
    {
        vcd_data_ += R"""($date
    Aug 27, 2021
$end
$version
   VCD generator tool version V0.1
$end
$timescale 1ps $end
)""";
    }